

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O0

void add_indexed_operand(m680x_info *info,m680x_reg base_reg,_Bool post_inc_dec,uint8_t inc_dec,
                        uint8_t offset_bits,uint16_t offset,_Bool no_comma)

{
  cs_m680x_op *op_00;
  char in_CL;
  byte in_DL;
  byte bVar1;
  int32_t in_ESI;
  m680x_info *in_RDI;
  uint8_t in_R8B;
  int16_t in_R9W;
  byte in_stack_00000008;
  cs_m680x_op *op;
  cs_m680x *m680x;
  
  bVar1 = (in_RDI->m680x).op_count;
  (in_RDI->m680x).op_count = bVar1 + 1;
  op_00 = (in_RDI->m680x).operands + bVar1;
  op_00->type = M680X_OP_INDEXED;
  set_operand_size(in_RDI,op_00,'\x01');
  (op_00->field_1).imm = in_ESI;
  (op_00->field_1).idx.offset_reg = M680X_REG_INVALID;
  (op_00->field_1).idx.inc_dec = in_CL;
  if ((in_CL != '\0') && ((in_DL & 1) != 0)) {
    (op_00->field_1).idx.flags = (op_00->field_1).idx.flags | 4;
  }
  if (in_R8B != '\0') {
    (op_00->field_1).idx.offset = in_R9W;
    (op_00->field_1).idx.offset_addr = 0;
  }
  (op_00->field_1).idx.offset_bits = in_R8B;
  bVar1 = 0;
  if ((in_stack_00000008 & 1) != 0) {
    bVar1 = 2;
  }
  (op_00->field_1).idx.flags = (op_00->field_1).idx.flags | bVar1;
  return;
}

Assistant:

static void add_indexed_operand(m680x_info *info, m680x_reg base_reg,
	bool post_inc_dec, uint8_t inc_dec, uint8_t offset_bits,
	uint16_t offset, bool no_comma)
{
	cs_m680x *m680x = &info->m680x;
	cs_m680x_op *op = &m680x->operands[m680x->op_count++];

	op->type = M680X_OP_INDEXED;
	set_operand_size(info, op, 1);
	op->idx.base_reg = base_reg;
	op->idx.offset_reg = M680X_REG_INVALID;
	op->idx.inc_dec = inc_dec;

	if (inc_dec && post_inc_dec)
		op->idx.flags |= M680X_IDX_POST_INC_DEC;

	if (offset_bits != M680X_OFFSET_NONE) {
		op->idx.offset = offset;
		op->idx.offset_addr = 0;
	}

	op->idx.offset_bits = offset_bits;
	op->idx.flags |= (no_comma ? M680X_IDX_NO_COMMA : 0);
}